

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_find(t_heap<xemmai::t_object> *this,void *a_p)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  ulong uVar4;
  bool bVar5;
  t_object *local_78;
  size_t j;
  _Self local_38;
  key_type local_30;
  _Self local_28;
  iterator i;
  void *a_p_local;
  t_heap<xemmai::t_object> *this_local;
  
  local_30 = (key_type)a_p;
  i._M_node = (_Base_ptr)a_p;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
       ::lower_bound(&this->v_blocks,&local_30);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
       ::end(&this->v_blocks);
  bVar2 = std::operator==(&local_28,&local_38);
  bVar5 = true;
  if (!bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>::operator->
                       (&local_28);
    bVar5 = ppVar3->first != (t_object *)i._M_node;
  }
  if (bVar5) {
    j = (size_t)std::
                map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
                ::begin(&this->v_blocks);
    bVar5 = std::operator==(&local_28,(_Self *)&j);
    if (bVar5) {
      return (t_object *)0x0;
    }
    std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>::operator--
              (&local_28);
  }
  iVar1._M_node = i._M_node;
  ppVar3 = std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>::operator->
                     (&local_28);
  uVar4 = (long)iVar1._M_node - (long)ppVar3->first;
  ppVar3 = std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>::operator->
                     (&local_28);
  if ((uVar4 < ppVar3->second) &&
     (ppVar3 = std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>::
               operator->(&local_28),
     (uVar4 & (0x80L << ((byte)ppVar3->first->v_rank & 0x3f)) - 1U) == 0)) {
    local_78 = (t_object *)i._M_node;
  }
  else {
    local_78 = (t_object *)0x0;
  }
  return local_78;
}

Assistant:

T* f_find(void* a_p)
	{
		auto i = v_blocks.lower_bound(static_cast<T*>(a_p));
		if (i == v_blocks.end() || i->first != a_p) {
			if (i == v_blocks.begin()) return nullptr;
			--i;
		}
		size_t j = static_cast<char*>(a_p) - reinterpret_cast<char*>(i->first);
		return j < i->second && (j & (c_UNIT << i->first->v_rank) - 1) == 0 ? static_cast<T*>(a_p) : nullptr;
	}